

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::promptClear(Private *this)

{
  usize uVar1;
  usize uVar2;
  ulong uVar3;
  usize uVar4;
  usize uVar5;
  char *pcVar6;
  long lVar7;
  String local_1a0;
  ulong local_178;
  usize count_1;
  usize i_3;
  undefined1 local_140 [8];
  String clearCmd_1;
  usize count;
  usize i_2;
  usize i_1;
  undefined1 local_b0 [8];
  String clearCmd;
  ulong local_50;
  usize i;
  String clearLine;
  usize additionalLines;
  usize bufferLen;
  Private *this_local;
  
  uVar1 = Array<unsigned_int>::size(&this->prompt);
  uVar2 = Array<unsigned_int>::size(&this->input);
  uVar3 = uVar1 + uVar2;
  clearLine._data.ref = uVar3 / this->stdoutScreenWidth;
  if (clearLine._data.ref == 0) {
    String::String((String *)local_140,uVar3 + 0xc);
    String::String<6ul>((String *)&i_3,(char (*) [6])"\x1b[?7l");
    String::append((String *)local_140,(String *)&i_3);
    String::~String((String *)&i_3);
    String::append((String *)local_140,'\r');
    local_178 = uVar3;
    for (count_1 = 0; count_1 < local_178; count_1 = count_1 + 1) {
      String::append((String *)local_140,' ');
    }
    String::append((String *)local_140,'\r');
    String::String<6ul>(&local_1a0,(char (*) [6])"\x1b[?7h");
    String::append((String *)local_140,&local_1a0);
    String::~String(&local_1a0);
    pcVar6 = String::operator_cast_to_char_((String *)local_140);
    uVar1 = String::length((String *)local_140);
    writeConsole(this,pcVar6,uVar1);
    String::~String((String *)local_140);
  }
  else {
    uVar4 = Array<unsigned_int>::size(&this->prompt);
    uVar1 = this->caretPos;
    uVar2 = this->caretPos;
    uVar5 = Array<unsigned_int>::size(&this->prompt);
    moveCursorPosition(this,uVar4 + uVar1,-(uVar2 + uVar5));
    String::String((String *)&i,this->stdoutScreenWidth + 2);
    for (local_50 = 0; local_50 < this->stdoutScreenWidth; local_50 = local_50 + 1) {
      String::append((String *)&i,' ');
    }
    String::String<3ul>((String *)&clearCmd._data.ref,(char (*) [3])"\n\r");
    String::append((String *)&i,(String *)&clearCmd._data.ref);
    String::~String((String *)&clearCmd._data.ref);
    String::String((String *)local_b0,uVar3 + 10 + clearLine._data.ref * 2);
    String::String<6ul>((String *)&i_1,(char (*) [6])"\x1b[?7l");
    String::append((String *)local_b0,(String *)&i_1);
    String::~String((String *)&i_1);
    for (i_2 = 0; i_2 < clearLine._data.ref; i_2 = i_2 + 1) {
      String::append((String *)local_b0,(String *)&i);
    }
    count = 0;
    lVar7 = clearLine._data.ref * this->stdoutScreenWidth;
    for (; count < uVar3 - lVar7; count = count + 1) {
      String::append((String *)local_b0,' ');
    }
    String::String<6ul>((String *)&clearCmd_1._data.ref,(char (*) [6])"\x1b[?7h");
    String::append((String *)local_b0,(String *)&clearCmd_1._data.ref);
    String::~String((String *)&clearCmd_1._data.ref);
    pcVar6 = String::operator_cast_to_char_((String *)local_b0);
    uVar1 = String::length((String *)local_b0);
    writeConsole(this,pcVar6,uVar1);
    uVar1 = Array<unsigned_int>::size(&this->prompt);
    uVar2 = Array<unsigned_int>::size(&this->input);
    moveCursorPosition(this,uVar1 + uVar2,-uVar3);
    String::~String((String *)local_b0);
    String::~String((String *)&i);
  }
  return;
}

Assistant:

void promptClear()
  {
    usize bufferLen = prompt.size() + input.size();
    usize additionalLines = bufferLen / stdoutScreenWidth;
    if(additionalLines)
    {
      moveCursorPosition(prompt.size() + caretPos, -(ssize)(caretPos + prompt.size()));
      String clearLine(stdoutScreenWidth + 2);
      for(usize i = 0; i < stdoutScreenWidth; ++i)
        clearLine.append(' ');
      clearLine.append("\n\r");
      String clearCmd(bufferLen + additionalLines * 2
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      for(usize i = 0; i < additionalLines; ++i)
        clearCmd.append(clearLine);
      for(usize i = 0, count = bufferLen - additionalLines * stdoutScreenWidth; i < count; ++i)
        clearCmd.append(' ');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
      moveCursorPosition(prompt.size() + input.size(), -(ssize)bufferLen);
    }
    else
    {
      String clearCmd(2 + bufferLen
#ifndef _MSC_VER
        + 10
#endif
      );
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7l");
#endif
      clearCmd.append('\r');
      for(usize i = 0, count = bufferLen; i < count; ++i)
        clearCmd.append(' ');
      clearCmd.append('\r');
#ifndef _MSC_VER
      clearCmd.append("\x1b[?7h");
#endif
      writeConsole(clearCmd, clearCmd.length());
    }
  }